

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.h
# Opt level: O2

void __thiscall
lemon::
VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_double>::
add(VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_double>
    *this,vector<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_> *keys)

{
  int iVar1;
  pointer pAVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  iVar3 = (int)((ulong)((long)(this->container).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->container).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  pAVar2 = (keys->
           super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(keys->
                        super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2) >> 2;
  uVar6 = 0;
  uVar5 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    iVar1 = pAVar2[uVar6]._id;
    if (iVar3 < iVar1) {
      iVar3 = iVar1;
    }
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->container,(long)(iVar3 + 1));
  return;
}

Assistant:

virtual void add(const std::vector<Key>& keys) {
    int max = container.size() - 1;
    for (int i = 0; i < int(keys.size()); ++i) {
      int id = Parent::notifier()->id(keys[i]);
      if (id >= max) {
        max = id;
      }
    }
    container.resize(max + 1);
  }